

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O2

void __thiscall
ADSBBase::ProcessV2(ADSBBase *this,JSON_Object *pJAc,FDKeyTy *fdKey,double tBufPeriod,
                   double adsbxTime,positionTy *viewPos)

{
  pointer pcVar1;
  posFlagsTy pVar2;
  bool bVar3;
  int iVar4;
  JSON_Value_Type JVar5;
  char *pcVar6;
  JSON_Value *value;
  mapped_type *this_00;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  positionTy local_2f8;
  string cat;
  string acTy;
  unique_lock<std::mutex> mapFdLock;
  string reg;
  FDDynamicData dyn;
  string local_1e8;
  FDStaticData stat;
  
  dVar8 = json_object_dotget_number(pJAc,"seen_pos");
  if (dVar8 < tBufPeriod) {
    pcVar6 = jog_s(pJAc,"type");
    iVar4 = strcmp(pcVar6,"tisb_other");
    if (iVar4 != 0) {
      dVar9 = jog_n_nan(pJAc,"lat");
      dVar10 = jog_n_nan(pJAc,"lon");
      dVar11 = jog_n_nan(pJAc,"alt_geom");
      local_2f8._head = jog_n_nan(pJAc,"true_heading");
      local_2f8._pitch = NAN;
      local_2f8._roll = NAN;
      local_2f8.mergeCount = 1;
      local_2f8.f = (posFlagsTy)0x0;
      pVar2 = local_2f8.f;
      local_2f8.f = (posFlagsTy)0x0;
      local_2f8.edgeIdx = 0xffffffffffffffff;
      local_2f8._lat = dVar9;
      local_2f8._lon = dVar10;
      local_2f8._alt = dVar11 * 0.3048;
      local_2f8._ts = adsbxTime - dVar8;
      if (NAN(local_2f8._head)) {
        local_2f8.f = pVar2;
        local_2f8._head = jog_n_nan(pJAc,"track");
      }
      if ((!NAN(dVar9) && !NAN(dVar10)) &&
         (dVar8 = CoordDistance(&local_2f8,viewPos),
         dVar8 <= (double)(dataRefs.fdStdDistance * 0x73c))) {
        value = json_object_get_value(pJAc,"alt_baro");
        if (value != (JSON_Value *)0x0) {
          JVar5 = json_value_get_type(value);
          if (JVar5 == 2) {
            pcVar6 = json_string(value);
            iVar4 = strcmp(pcVar6,"ground");
            if (iVar4 == 0) {
              local_2f8.f = (posFlagsTy)((ushort)local_2f8.f & 0xfcff | 0x200);
              local_2f8._alt = NAN;
            }
          }
          else if (JVar5 == 3) {
            local_2f8.f = (posFlagsTy)((ushort)local_2f8.f & 0xfcff | 0x100);
            dVar9 = json_number(value);
            dVar10 = jog_n_nan(pJAc,"nav_qnh");
            if (NAN(dVar10)) {
              dVar10 = (double)dataRefs.lastWeatherHPA;
            }
            local_2f8._alt = BaroAltToGeoAlt_ft(dVar9,dVar10);
            local_2f8._alt = local_2f8._alt * 0.3048;
          }
        }
        if ((((ushort)local_2f8.f & 0x300) == 0x200) || (!NAN(local_2f8._alt))) {
          pcVar6 = jog_s(pJAc,"r");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&reg,pcVar6,(allocator<char> *)&stat);
          pcVar6 = jog_s(pJAc,"t");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&acTy,pcVar6,(allocator<char> *)&stat);
          pcVar6 = jog_s(pJAc,"category");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cat,pcVar6,(allocator<char> *)&stat);
          bVar3 = std::operator==(&cat,"C1");
          if ((bVar3) ||
             (((bVar3 = std::operator==(&cat,"C2"), bVar3 ||
               (bVar3 = std::operator==(&reg,"GND"), bVar3)) ||
              (bVar3 = std::operator==(&acTy,"GND"), bVar3)))) {
            std::__cxx11::string::_M_assign((string *)&acTy);
          }
          else {
            bVar3 = std::operator==(&reg,"TWR");
            if ((((bVar3) || (bVar3 = std::operator==(&acTy,"TWR"), bVar3)) ||
                (bVar3 = std::operator==(&cat,"C3"), bVar3)) ||
               (((((ushort)local_2f8.f & 0x300) == 0x200 && (acTy._M_string_length == 0)) &&
                ((reg._M_string_length == 0 && (cat._M_string_length == 0)))))) {
              std::__cxx11::string::assign((char *)&acTy);
              std::__cxx11::string::_M_assign((string *)&reg);
              std::__cxx11::string::assign((char *)&cat);
            }
          }
          std::unique_lock<std::mutex>::unique_lock(&mapFdLock,&mapFdMutex);
          LTFlightData::CheckDupKey(fdKey,KEY_FLARM);
          if (fdKey->eKeyType == KEY_ADSBEX) {
            LTFlightData::CheckDupKey(fdKey,KEY_RT);
          }
          this_00 = std::
                    map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                    ::operator[](&mapFd,fdKey);
          std::recursive_mutex::lock(&this_00->dataAccessMutex);
          std::unique_lock<std::mutex>::unlock(&mapFdLock);
          if ((this_00->acKey).key._M_string_length == 0) {
            LTFlightData::SetKey(this_00,fdKey);
          }
          stat.reg._M_dataplus._M_p = (pointer)&stat.reg.field_2;
          stat.reg._M_string_length = 0;
          stat.reg.field_2._M_local_buf[0] = '\0';
          stat.country._M_dataplus._M_p = (pointer)&stat.country.field_2;
          stat.country._M_string_length = 0;
          stat.country.field_2._M_local_buf[0] = '\0';
          stat.acTypeIcao._M_dataplus._M_p = (pointer)&stat.acTypeIcao.field_2;
          stat.acTypeIcao._M_string_length = 0;
          stat.acTypeIcao.field_2._M_local_buf[0] = '\0';
          stat.man._M_dataplus._M_p = (pointer)&stat.man.field_2;
          stat.man._M_string_length = 0;
          stat.man.field_2._M_local_buf[0] = '\0';
          stat.mdl._M_dataplus._M_p = (pointer)&stat.mdl.field_2;
          stat.mdl._M_string_length = 0;
          stat.mdl.field_2._M_local_buf[0] = '\0';
          stat.catDescr._M_dataplus._M_p = (pointer)&stat.catDescr.field_2;
          stat.catDescr._M_string_length = 0;
          stat.catDescr.field_2._M_local_buf[0] = '\0';
          stat.engType = -1;
          stat.engMount = -1;
          stat.year = 0;
          stat.mil = false;
          stat.pDoc8643 = (Doc8643 *)0x0;
          stat.call._M_dataplus._M_p = (pointer)&stat.call.field_2;
          stat.call._M_string_length = 0;
          stat.call.field_2._M_local_buf[0] = '\0';
          stat.stops.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          stat.stops.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          stat.stops.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          stat.flight._M_dataplus._M_p = (pointer)&stat.flight.field_2;
          stat.flight._M_string_length = 0;
          stat.flight.field_2._M_local_buf[0] = '\0';
          stat.slug._M_dataplus._M_p = (pointer)&stat.slug.field_2;
          stat.slug._M_string_length = 0;
          stat.slug.field_2._M_local_buf[0] = '\0';
          stat.op._M_dataplus._M_p = (pointer)&stat.op.field_2;
          stat.op._M_string_length = 0;
          stat.op.field_2._M_local_buf[0] = '\0';
          stat.opIcao._M_dataplus._M_p = (pointer)&stat.opIcao.field_2;
          stat.opIcao._M_string_length = 0;
          stat.opIcao.field_2._M_local_buf[0] = '\0';
          stat.bDataMaster = false;
          stat.bDataRoute = false;
          std::__cxx11::string::_M_assign((string *)&stat);
          std::__cxx11::string::_M_assign((string *)&stat.acTypeIcao);
          lVar7 = jog_l(pJAc,"dbFlags");
          stat.mil = (bool)((byte)lVar7 & 1);
          jog_s(pJAc,"flight");
          std::__cxx11::string::assign((char *)&stat.call);
          trim(&stat.call," \t\f\v\r\n");
          GetADSBEmitterCat(&cat);
          std::__cxx11::string::assign((char *)&stat.catDescr);
          std::__cxx11::string::_M_assign((string *)&stat.slug);
          std::__cxx11::string::append((string *)&stat.slug);
          LTFlightData::FDDynamicData::FDDynamicData(&dyn);
          dyn.radar.code = jog_sl(pJAc,"squawk");
          dyn.gnd = ((ushort)local_2f8.f & 0x300) == 0x200;
          dyn.heading = local_2f8._head;
          dyn.spd = jog_n_nan(pJAc,"gs");
          dyn.vsi = jog_n_nan(pJAc,"geom_rate");
          if (NAN(dyn.vsi)) {
            dyn.vsi = jog_n_nan(pJAc,"baro_rate");
          }
          dyn.ts = local_2f8._ts;
          dyn.pChannel = (LTChannel *)this;
          LTFlightData::UpdateData(this_00,&stat,dVar8,DATREQU_NONE);
          bVar3 = positionTy::isNormal(&local_2f8,true);
          if (bVar3) {
            LTFlightData::AddDynData(this_00,&dyn,0,0,&local_2f8);
          }
          else if ((int)dataRefs.iLogLevel < 1) {
            pcVar1 = (fdKey->key)._M_dataplus._M_p;
            positionTy::dbgTxt_abi_cxx11_(&local_1e8,&local_2f8);
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
                   ,0x13a,"ProcessV2",logDEBUG,"A/c %s reached invalid pos: %s",pcVar1,
                   local_1e8._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_1e8);
          }
          LTFlightData::FDStaticData::~FDStaticData(&stat);
          pthread_mutex_unlock((pthread_mutex_t *)&this_00->dataAccessMutex);
          std::unique_lock<std::mutex>::~unique_lock(&mapFdLock);
          std::__cxx11::string::~string((string *)&cat);
          std::__cxx11::string::~string((string *)&acTy);
          std::__cxx11::string::~string((string *)&reg);
        }
      }
    }
  }
  return;
}

Assistant:

void ADSBBase::ProcessV2 (const JSON_Object* pJAc,
                          LTFlightData::FDKeyTy& fdKey,
                          const double tBufPeriod,
                          const double adsbxTime,
                          const positionTy& viewPos)
{
    // skip stale data
    const double ageOfPos = jog_n(pJAc, ADSBEX_V2_SEE_POS);
    if (ageOfPos >= tBufPeriod)
        return;
    
    // skip TIS-B data...that is stuff that comes and goes with new ids every few requests, unusable
    if (!std::strcmp(jog_s(pJAc, ADSBEX_V2_TRANSP_TYPE),ADSBEX_V2_TYPE_TISB))
        return;
    
    // Try getting best possible position information
    // Some fields can come back NAN if not defined
    positionTy pos (jog_n_nan(pJAc, ADSBEX_V2_LAT),
                    jog_n_nan(pJAc, ADSBEX_V2_LON),
                    jog_n_nan(pJAc, ADSBEX_V2_ALT_GEOM) * M_per_FT,
                    adsbxTime - ageOfPos,
                    jog_n_nan(pJAc, ADSBEX_V2_HEADING));
    // If heading isn't available try track
    if (std::isnan(pos.heading()))
        pos.heading() = jog_n_nan(pJAc, ADSBEX_V2_TRACK);
    
    // If lat/lon isn't defined then the tracking data is stale: discard
    if (std::isnan(pos.lat()) || std::isnan(pos.lon()))
        return;
    
    // ADSBEx, especially the RAPID API version, returns
    // aircraft regardless of distance. To avoid planes
    // created and immediately removed due to distanced settings
    // we continue only if pos is within wanted range
    const double dist = pos.dist(viewPos);
    if (dist > dataRefs.GetFdStdDistance_m() )
        return;
    
    // The alt_baro field is string "ground" if on ground or can hold a baro altitude number
    const JSON_Value* pAltBaro = json_object_get_value(pJAc, ADSBEX_V2_ALT_BARO);
    if (pAltBaro) {
        switch (json_value_get_type(pAltBaro))
        {
            case JSONNumber:
            {
                pos.f.onGrnd = GND_OFF;         // we are definitely off ground
                // But we also process baro alt, potentially even overwriting a geo alt as baro alt is more accurate based on experience
                // try converting baro alt from given QNH, otherwise we use our own weather
                const double baro_alt = json_number(pAltBaro);
                const double qnh = jog_n_nan(pJAc, ADSBEX_V2_NAV_QNH);
                if (std::isnan(qnh))
                    pos.SetAltFt(BaroAltToGeoAlt_ft(baro_alt, dataRefs.GetPressureHPA()));
                else
                    pos.SetAltFt(BaroAltToGeoAlt_ft(baro_alt, qnh));
                break;
            }
                
            case JSONString:
                // There is just one string we are aware of: "ground"
                if (!strcmp(json_string(pAltBaro), "ground")) {
                    pos.f.onGrnd = GND_ON;
                    pos.alt_m() = NAN;
                }
                break;
        }
    }
    // _Some_ altitude info needs to be available now, otherwise skip data
    if (!pos.IsOnGnd() && std::isnan(pos.alt_m()))
        return;
    
    // Are we to skip static objects?
    std::string reg = jog_s(pJAc, ADSBEX_V2_REG);
    std::string acTy = jog_s(pJAc, ADSBEX_V2_AC_TYPE_ICAO);
    std::string cat = jog_s(pJAc, ADSBEX_V2_AC_CATEGORY);
    
    // Identify ground vehicles
    if (cat  == "C1"  || cat == "C2" ||
        reg  == "GND" ||
        acTy == "GND")
        acTy = dataRefs.GetDefaultCarIcaoType();
    // Mark all static objects equally, so they can optionally be hidden
    else if (reg  == STATIC_OBJECT_TYPE ||
             acTy == STATIC_OBJECT_TYPE ||
             cat  == "C3" ||
             // Everything else on the ground, which has no type, registration, category is considered static
             (pos.IsOnGnd() && acTy.empty() && reg.empty() && cat.empty()))

    {
        reg = acTy = STATIC_OBJECT_TYPE;
        cat = "C3";
    }

    // from here on access to fdMap guarded by a mutex
    // until FD object is inserted and updated
    std::unique_lock<std::mutex> mapFdLock (mapFdMutex);
    
    // Check for duplicates with OGN/FLARM, potentially replaces the key type
    LTFlightData::CheckDupKey(fdKey, LTFlightData::KEY_FLARM);
    // Some internal codes sometimes overlap with RealTraffic
    if (fdKey.eKeyType == LTFlightData::KEY_ADSBEX)
        LTFlightData::CheckDupKey(fdKey, LTFlightData::KEY_RT);

    // get the fd object from the map, key is the transpIcao
    // this fetches an existing or, if not existing, creates a new one
    LTFlightData& fd = mapFd[fdKey];
    
    // also get the data access lock once and for all
    // so following fetch/update calls only make quick recursive calls
    std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
    // now that we have the detail lock we can release the global one
    mapFdLock.unlock();
    
    // completely new? fill key fields
    if ( fd.empty() )
        fd.SetKey(fdKey);
    
    // -- fill static data --
    LTFlightData::FDStaticData stat;
    stat.reg =        reg;
    stat.acTypeIcao = acTy;
    stat.mil =        (jog_l(pJAc, ADSBEX_V2_FLAGS) & 0x01) == 0x01;
    stat.call =       jog_s(pJAc, ADSBEX_V2_FLIGHT);
    trim(stat.call);
    stat.catDescr = GetADSBEmitterCat(cat);
    stat.slug       = sSlugBase;
    stat.slug      += fdKey.key;
    
    // -- dynamic data --
    LTFlightData::FDDynamicData dyn;
    
    // non-positional dynamic data
    dyn.radar.code =        jog_sl(pJAc, ADSBEX_V2_RADAR_CODE);
    dyn.gnd =               pos.IsOnGnd();
    dyn.heading =           pos.heading();
    dyn.spd =               jog_n_nan(pJAc, ADSBEX_V2_SPD);
    dyn.vsi =               jog_n_nan(pJAc, ADSBEX_V2_VSI_GEOM);
    if (std::isnan(dyn.vsi))
        dyn.vsi =           jog_n_nan(pJAc, ADSBEX_V2_VSI_BARO);
    dyn.ts =                pos.ts();
    dyn.pChannel =          this;
    
    // update the a/c's master data
    fd.UpdateData(std::move(stat), dist);
    
    // position is rather important, we check for validity
    if ( pos.isNormal(true) ) {
        fd.AddDynData(dyn, 0, 0, &pos);
    }
    else
        LOG_MSG(logDEBUG,ERR_POS_UNNORMAL,fdKey.c_str(),pos.dbgTxt().c_str());
}